

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O1

string * chaiscript::exception::load_module_error::format_error
                   (string *__return_storage_ptr__,string *t_name,
                   vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
                   *t_errors)

{
  pointer plVar1;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  load_module_error *err;
  pointer plVar4;
  stringstream ss;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error loading module \'",0x16);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(t_name->_M_dataplus)._M_p,t_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"  The following locations were searched:\n",0x29);
  plVar1 = (t_errors->
           super__Vector_base<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (plVar4 = (t_errors->
                super__Vector_base<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
                )._M_impl.super__Vector_impl_data._M_start; plVar4 != plVar1; plVar4 = plVar4 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
    __s = (char *)(**(code **)(*(long *)plVar4 + 0x10))(plVar4);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

static std::string format_error(const std::string &t_name, const std::vector<load_module_error> &t_errors) {
        std::stringstream ss;
        ss << "Error loading module '" << t_name << "'\n"
           << "  The following locations were searched:\n";

        for (const auto &err : t_errors) {
          ss << "    " << err.what() << "\n";
        }

        return ss.str();
      }